

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O2

int Zyx_TestGetTruthTablePars(char *pFileName,word *pTruth,int *nVars,int *nLutSize,int *nNodes)

{
  int iVar1;
  size_t sVar2;
  byte *pbVar3;
  byte *__s;
  byte bVar4;
  char *__s_00;
  byte *__nptr;
  bool bVar5;
  
  if (pFileName == (char *)0x0) {
    pbVar3 = (byte *)0x0;
    __s = pbVar3;
  }
  else {
    sVar2 = strlen(pFileName);
    pbVar3 = (byte *)malloc(sVar2 + 1);
    strcpy((char *)pbVar3,pFileName);
    __s = pbVar3;
  }
  for (; (bVar4 = *pbVar3, bVar4 != 0 &&
         ((0xf5 < (byte)(bVar4 - 0x3a) || (0xf9 < (byte)((bVar4 & 0xdf) + 0xb9)))));
      pbVar3 = pbVar3 + 1) {
  }
  *pbVar3 = 0;
  sVar2 = strlen((char *)__s);
  iVar1 = (int)sVar2;
  switch(iVar1) {
  case 1:
    iVar1 = 2;
    break;
  case 2:
    iVar1 = 3;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
switchD_004a967a_caseD_3:
    free(__s);
    __s_00 = "Invalid truth table size.";
    goto LAB_004a9747;
  case 4:
    iVar1 = 4;
    break;
  case 8:
    iVar1 = 5;
    break;
  default:
    if (iVar1 == 0x10) {
      iVar1 = 6;
    }
    else if (iVar1 == 0x20) {
      iVar1 = 7;
    }
    else {
      if (iVar1 != 0x40) goto switchD_004a967a_caseD_3;
      iVar1 = 8;
    }
  }
  *nVars = iVar1;
  Abc_TtReadHex(pTruth,(char *)__s);
  *pbVar3 = bVar4;
  do {
    if (bVar4 == 0) goto LAB_004a9727;
    __nptr = pbVar3 + 1;
    bVar5 = bVar4 != 0x2d;
    bVar4 = pbVar3[1];
    pbVar3 = __nptr;
  } while (bVar5);
  if (bVar4 == 0) {
LAB_004a9727:
    free(__s);
    __s_00 = "Expecting \'-\' after truth table before LUT size.";
  }
  else {
    iVar1 = atoi((char *)__nptr);
    *nLutSize = iVar1;
    do {
      if (bVar4 == 0) goto LAB_004a9738;
      pbVar3 = __nptr + 1;
      bVar5 = bVar4 != 0x2d;
      bVar4 = __nptr[1];
      __nptr = pbVar3;
    } while (bVar5);
    if (bVar4 != 0) {
      iVar1 = atoi((char *)pbVar3);
      *nNodes = iVar1;
      free(__s);
      return 1;
    }
LAB_004a9738:
    free(__s);
    __s_00 = "Expecting \'-\' after LUT size before node count.";
  }
LAB_004a9747:
  puts(__s_00);
  return 0;
}

Assistant:

int Zyx_TestGetTruthTablePars( char * pFileName, word * pTruth, int * nVars, int * nLutSize, int * nNodes )
{
    char Symb, * pCur, * pBuffer = Abc_UtilStrsav( pFileName );
    int nLength;
    for ( pCur = pBuffer; *pCur; pCur++ )
        if ( !Abc_TtIsHexDigit(*pCur) )
            break;
    Symb = *pCur; *pCur = 0;
    nLength = (int)strlen(pBuffer);
    if ( nLength == 1 )
        *nVars = 2;
    else if ( nLength == 2 )
        *nVars = 3;
    else if ( nLength == 4 )
        *nVars = 4;
    else if ( nLength == 8 )
        *nVars = 5;
    else if ( nLength == 16 )
        *nVars = 6;
    else if ( nLength == 32 )
        *nVars = 7;
    else if ( nLength == 64 )
        *nVars = 8;
    else
    {
        ABC_FREE( pBuffer );
        printf( "Invalid truth table size.\n" );
        return 0;
    }
    Abc_TtReadHex( pTruth, pBuffer );
    *pCur = Symb;
    // read LUT size
    while ( *pCur && *pCur++ != '-' );
    if ( *pCur == 0 )
    {
        ABC_FREE( pBuffer );
        printf( "Expecting \'-\' after truth table before LUT size.\n" );
        return 0;
    }
    // read node count
    *nLutSize = atoi(pCur);
    while ( *pCur && *pCur++ != '-' );
    if ( *pCur == 0 )
    {
        ABC_FREE( pBuffer );
        printf( "Expecting \'-\' after LUT size before node count.\n" );
        return 0;
    }
    *nNodes = atoi(pCur);
    ABC_FREE( pBuffer );
    return 1;
}